

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

Token * __thiscall inja::Lexer::scan_id(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  const_pointer pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar5 = (this->m_in).size_;
  if (this->m_pos < uVar5) {
    pcVar2 = (this->m_in).data_;
    uVar4 = this->m_pos;
    do {
      uVar6 = uVar4 + 1;
      bVar1 = pcVar2[uVar4];
      iVar3 = isalnum((int)(char)bVar1);
      if (((iVar3 == 0) && (2 < bVar1 - 0x2d)) && (bVar1 != 0x5f)) break;
      this->m_pos = uVar6;
      uVar4 = uVar6;
    } while (uVar6 != uVar5);
  }
  local_40.data_ = (this->m_in).data_;
  local_40.size_ = (this->m_in).size_;
  uVar5 = this->m_tok_start;
  if (local_40.size_ < this->m_tok_start) {
    uVar5 = local_40.size_;
  }
  uVar4 = this->m_pos;
  if (this->m_pos < uVar5) {
    uVar4 = uVar5;
  }
  if (local_40.size_ <= uVar4) {
    uVar4 = local_40.size_;
  }
  bVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_40,uVar5,uVar4 - uVar5);
  __return_storage_ptr__->kind = Id;
  (__return_storage_ptr__->text).data_ = bVar7.data_;
  (__return_storage_ptr__->text).size_ = bVar7.size_;
  return __return_storage_ptr__;
}

Assistant:

Token scan_id() {
		for (;;) {
			if (m_pos >= m_in.size()) {
				break;
			}
			char ch = m_in[m_pos];
			if (!std::isalnum(ch) && ch != '.' && ch != '/' && ch != '_' && ch != '-') {
				break;
			}
			m_pos += 1;
		}
		return make_token(Token::Kind::Id);
	}